

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_d6fcf8::TGlslangToSpvTraverser::addMeshNVDecoration
          (TGlslangToSpvTraverser *this,Id id,int member,TQualifier *qualifier)

{
  TIntermediate *pTVar1;
  const_iterator cVar2;
  ulong uVar3;
  _Rb_tree_header *p_Var4;
  Capability CVar5;
  char *pcVar6;
  allocator<char> local_51;
  key_type local_50;
  
  pTVar1 = this->glslangIntermediate;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GL_EXT_mesh_shader",&local_51);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(pTVar1->requestedExtensions)._M_t,&local_50);
  p_Var4 = &(this->glslangIntermediate->requestedExtensions)._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_dispose();
  uVar3 = *(ulong *)&qualifier->field_0x8;
  if (member < 0) {
    if ((uVar3 >> 0x29 & 1) != 0) {
      if (this->glslangIntermediate->language == EShLangFragment) {
        CVar5 = CapabilityMeshShadingEXT;
        if ((_Rb_tree_header *)cVar2._M_node == p_Var4) {
          CVar5 = CapabilityMeshShadingNV;
        }
        pcVar6 = "SPV_EXT_mesh_shader";
        if ((_Rb_tree_header *)cVar2._M_node == p_Var4) {
          pcVar6 = "SPV_NV_mesh_shader";
        }
        spv::Builder::addCapability(&this->builder,CVar5);
        spv::Builder::addExtension(&this->builder,pcVar6);
      }
      spv::Builder::addDecoration(&this->builder,id,DecorationPerPrimitiveEXT,-1);
      uVar3 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar3 & 0x40000000000) != 0) {
      spv::Builder::addDecoration(&this->builder,id,DecorationPerViewNV,-1);
      uVar3 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar3 & 0x80000000000) != 0) {
      spv::Builder::addDecoration(&this->builder,id,DecorationPerTaskNV,-1);
    }
  }
  else {
    if ((uVar3 >> 0x29 & 1) != 0) {
      if (this->glslangIntermediate->language == EShLangFragment) {
        CVar5 = CapabilityMeshShadingEXT;
        if ((_Rb_tree_header *)cVar2._M_node == p_Var4) {
          CVar5 = CapabilityMeshShadingNV;
        }
        pcVar6 = "SPV_EXT_mesh_shader";
        if ((_Rb_tree_header *)cVar2._M_node == p_Var4) {
          pcVar6 = "SPV_NV_mesh_shader";
        }
        spv::Builder::addCapability(&this->builder,CVar5);
        spv::Builder::addExtension(&this->builder,pcVar6);
      }
      spv::Builder::addMemberDecoration(&this->builder,id,member,DecorationPerPrimitiveEXT,-1);
      uVar3 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar3 & 0x40000000000) != 0) {
      spv::Builder::addMemberDecoration(&this->builder,id,member,DecorationPerViewNV,-1);
      uVar3 = *(ulong *)&qualifier->field_0x8;
    }
    if ((uVar3 & 0x80000000000) != 0) {
      spv::Builder::addMemberDecoration(&this->builder,id,member,DecorationPerTaskNV,-1);
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addMeshNVDecoration(spv::Id id, int member, const glslang::TQualifier& qualifier)
{
    bool isMeshShaderExt = (glslangIntermediate->getRequestedExtensions().find(glslang::E_GL_EXT_mesh_shader) !=
                            glslangIntermediate->getRequestedExtensions().end());

    if (member >= 0) {
        if (qualifier.perPrimitiveNV) {
            // Need to add capability/extension for fragment shader.
            // Mesh shader already adds this by default.
            if (glslangIntermediate->getStage() == EShLangFragment) {
                if(isMeshShaderExt) {
                    builder.addCapability(spv::CapabilityMeshShadingEXT);
                    builder.addExtension(spv::E_SPV_EXT_mesh_shader);
                } else {
                    builder.addCapability(spv::CapabilityMeshShadingNV);
                    builder.addExtension(spv::E_SPV_NV_mesh_shader);
                }
            }
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerPrimitiveNV);
        }
        if (qualifier.perViewNV)
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerViewNV);
        if (qualifier.perTaskNV)
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerTaskNV);
    } else {
        if (qualifier.perPrimitiveNV) {
            // Need to add capability/extension for fragment shader.
            // Mesh shader already adds this by default.
            if (glslangIntermediate->getStage() == EShLangFragment) {
                if(isMeshShaderExt) {
                    builder.addCapability(spv::CapabilityMeshShadingEXT);
                    builder.addExtension(spv::E_SPV_EXT_mesh_shader);
                } else {
                    builder.addCapability(spv::CapabilityMeshShadingNV);
                    builder.addExtension(spv::E_SPV_NV_mesh_shader);
                }
            }
            builder.addDecoration(id, spv::DecorationPerPrimitiveNV);
        }
        if (qualifier.perViewNV)
            builder.addDecoration(id, spv::DecorationPerViewNV);
        if (qualifier.perTaskNV)
            builder.addDecoration(id, spv::DecorationPerTaskNV);
    }
}